

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

BinsSelectExpr * __thiscall
slang::ast::BinSelectWithFilterExpr::fromSyntax
          (BinSelectWithFilterExpr *this,BinSelectWithFilterExprSyntax *syntax,ASTContext *context)

{
  SyntaxNode *pSVar1;
  BumpAllocator *this_00;
  int *piVar2;
  long lVar3;
  Scope *args;
  long lVar4;
  ExpressionSyntax *syntax_00;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  Type *pTVar8;
  Expression *expr;
  ExpressionPatternSyntax *pEVar9;
  Expression *this_01;
  Type *pTVar10;
  BinSelectWithFilterExpr *pBVar11;
  char *func;
  long lVar12;
  TempVarSymbol *__old_val;
  IteratorSymbol *pIVar13;
  Expression *matches;
  ASTContext iterCtx;
  Expression *local_88;
  BinsSelectExpr *local_80;
  BinSelectWithFilterExpr *local_78;
  long local_70;
  ASTContext local_68;
  BinsSelectExpr *pBVar7;
  
  pSVar1 = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
  if (pSVar1 != (SyntaxNode *)0x0) {
    if (this->expr == (BinsSelectExpr *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::BinsSelectExpressionSyntax *>::get() const [T = slang::syntax::BinsSelectExpressionSyntax *]"
      ;
      goto LAB_003ddcfc;
    }
    this_00 = (BumpAllocator *)pSVar1->parent;
    iVar6 = BinsSelectExpr::bind((int)this->expr,(sockaddr *)syntax,(socklen_t)context);
    pBVar7 = (BinsSelectExpr *)CONCAT44(extraout_var,iVar6);
    local_68.assertionInstance = (AssertionInstanceDetails *)(syntax->openParen).info;
    local_68.scope.ptr = (Scope *)(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent
    ;
    local_68.lookupIndex = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind;
    local_68._12_4_ =
         *(undefined4 *)&(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.field_0xc;
    local_68.flags.m_bits = (underlying_type)(syntax->expr).ptr;
    local_68.instanceOrProc = *(Symbol **)&syntax->with;
    local_68.firstTempVar = (TempVarSymbol *)(syntax->with).info;
    local_68.randomizeDetails = *(RandomizeDetails **)&syntax->openParen;
    pSVar1 = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
    if (pSVar1 != (SyntaxNode *)0x0) {
      piVar2 = *(int **)(*(long *)(*(long *)&pSVar1->kind + 0x20) + 8);
      local_80 = pBVar7;
      local_78 = this;
      if (*piVar2 != 0x57) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::CoverCrossSymbol]");
      }
      lVar3 = *(long *)(piVar2 + 0x1e);
      if (lVar3 != 0) {
        local_70 = *(long *)(piVar2 + 0x1c);
        lVar12 = 0;
        pIVar13 = (IteratorSymbol *)local_68.firstTempVar;
        do {
          args = (Scope *)(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
          local_68.firstTempVar = &pIVar13->super_TempVarSymbol;
          if (args == (Scope *)0x0) goto LAB_003ddce7;
          lVar4 = *(long *)(local_70 + lVar12);
          pTVar8 = DeclaredType::getType((DeclaredType *)(lVar4 + 0x70));
          local_68.firstTempVar =
               &BumpAllocator::
                emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::Type_const&>
                          (this_00,args,
                           (basic_string_view<char,_std::char_traits<char>_> *)(lVar4 + 8),
                           (SourceLocation *)(lVar4 + 0x18),pTVar8)->super_TempVarSymbol;
          (((IteratorSymbol *)local_68.firstTempVar)->super_TempVarSymbol).nextTemp =
               &pIVar13->super_TempVarSymbol;
          lVar12 = lVar12 + 8;
          pIVar13 = (IteratorSymbol *)local_68.firstTempVar;
        } while (lVar3 << 3 != lVar12);
      }
      pBVar11 = local_78;
      if (local_78[1].expr != (BinsSelectExpr *)0x0) {
        expr = bindCovergroupExpr((ExpressionSyntax *)local_78[1].expr,&local_68,(Type *)0x0,
                                  (bitmask<slang::ast::ASTFlags>)0x0);
        ASTContext::requireBooleanConvertible(&local_68,expr);
        local_88 = (Expression *)0x0;
        if (*(long *)&pBVar11[2].super_BinsSelectExpr == 0) {
LAB_003ddcc1:
          pBVar11 = BumpAllocator::
                    emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                              (this_00,local_80,expr,&local_88);
          return &pBVar11->super_BinsSelectExpr;
        }
        pSVar1 = *(SyntaxNode **)(*(long *)&pBVar11[2].super_BinsSelectExpr + 0x20);
        if (pSVar1 == (SyntaxNode *)0x0) {
          func = 
          "T slang::not_null<slang::syntax::PatternSyntax *>::get() const [T = slang::syntax::PatternSyntax *]"
          ;
          goto LAB_003ddcfc;
        }
        pEVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>(pSVar1);
        syntax_00 = (pEVar9->expr).ptr;
        if (syntax_00 != (ExpressionSyntax *)0x0) {
          this_01 = bindCovergroupExpr(syntax_00,(ASTContext *)syntax,(Type *)0x0,
                                       (bitmask<slang::ast::ASTFlags>)0x800);
          local_88 = this_01;
          bVar5 = Expression::bad(this_01);
          if (!bVar5) {
            pTVar8 = (this_01->type).ptr;
            if (pTVar8 == (Type *)0x0) {
              func = 
              "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              ;
              goto LAB_003ddcfc;
            }
            pTVar10 = pTVar8->canonical;
            if (pTVar10 == (Type *)0x0) {
              Type::resolveCanonical(pTVar8);
              pTVar10 = pTVar8->canonical;
            }
            if ((pTVar10->super_Symbol).kind != UnboundedType) {
              ASTContext::requireIntegral((ASTContext *)syntax,this_01);
            }
          }
          goto LAB_003ddcc1;
        }
      }
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_003ddcfc;
    }
  }
LAB_003ddce7:
  func = "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
  ;
LAB_003ddcfc:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

BinsSelectExpr& BinSelectWithFilterExpr::fromSyntax(const BinSelectWithFilterExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);

    // Create the iterator variables for all of the parent cross items
    // and then bind the filter expression.
    ASTContext iterCtx = context;

    auto& cross = context.scope->asSymbol().getParentScope()->asSymbol().as<CoverCrossSymbol>();
    for (auto target : cross.targets) {
        auto it = comp.emplace<IteratorSymbol>(*context.scope, target->name, target->location,
                                               target->getType());
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);
    }

    auto& filter = bindCovergroupExpr(*syntax.filter, iterCtx);
    iterCtx.requireBooleanConvertible(filter);

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    return *comp.emplace<BinSelectWithFilterExpr>(expr, filter, matches);
}